

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_encoder.cc
# Opt level: O0

Status * __thiscall draco::StlEncoder::EncodeToFile(StlEncoder *this,Mesh *mesh,string *file_name)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  undefined8 in_RDX;
  allocator<char> *in_RSI;
  Mesh *in_RDI;
  EncoderBuffer buffer;
  unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_> file;
  Status *_local_status;
  undefined8 in_stack_ffffffffffffff28;
  Code code;
  EncoderBuffer *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  EncoderBuffer *in_stack_ffffffffffffff48;
  Mesh *this_00;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  byte bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  allocator<char> local_49;
  string local_48 [72];
  
  code = (Code)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  *(undefined8 *)(in_RSI + 0x10) = in_RDX;
  this_00 = in_RDI;
  FileWriterFactory::OpenWriter((string *)in_RDI);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>
                      *)0x1490cf);
  if (bVar1) {
    EncoderBuffer::EncoderBuffer(in_stack_ffffffffffffff30);
    bVar4 = 0;
    EncodeToBuffer((StlEncoder *)this_00,in_RDI,in_stack_ffffffffffffff48);
    bVar1 = Status::ok((Status *)in_RDI);
    if (!bVar1) {
      bVar4 = 1;
    }
    in_stack_ffffffffffffff47 = bVar1;
    if ((bVar4 & 1) == 0) {
      Status::~Status((Status *)0x149244);
    }
    if (bVar1) {
      in_stack_ffffffffffffff30 =
           (EncoderBuffer *)
           std::
           unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>
           ::operator->((unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>
                         *)0x14925b);
      pcVar2 = EncoderBuffer::data((EncoderBuffer *)0x14926a);
      sVar3 = EncoderBuffer::size((EncoderBuffer *)0x14927b);
      (*(*(_func_int ***)
          &(in_stack_ffffffffffffff30->buffer_).super__Vector_base<char,_std::allocator<char>_>.
           _M_impl)[2])(in_stack_ffffffffffffff30,pcVar2,sVar3);
      OkStatus();
    }
    EncoderBuffer::~EncoderBuffer(in_stack_ffffffffffffff30);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff70,
               (char *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),in_RSI);
    Status::Status((Status *)in_stack_ffffffffffffff30,code,(string *)0x14911b);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>::
  ~unique_ptr((unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>
               *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  return (Status *)this_00;
}

Assistant:

Status StlEncoder::EncodeToFile(const Mesh &mesh,
                                const std::string &file_name) {
  in_mesh_ = &mesh;
  std::unique_ptr<FileWriterInterface> file =
      FileWriterFactory::OpenWriter(file_name);
  if (!file) {
    return Status(Status::IO_ERROR, "File couldn't be opened");
  }
  // Encode the mesh into a buffer.
  EncoderBuffer buffer;
  DRACO_RETURN_IF_ERROR(EncodeToBuffer(mesh, &buffer));
  // Write the buffer into the file.
  file->Write(buffer.data(), buffer.size());
  return OkStatus();
}